

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::~XMLSchemaDescriptionImpl(XMLSchemaDescriptionImpl *this)

{
  MemoryManager *pMVar1;
  XMLSchemaDescriptionImpl *this_local;
  
  (this->super_XMLSchemaDescription).super_XMLGrammarDescription.super_XSerializable.
  _vptr_XSerializable = (_func_int **)&PTR__XMLSchemaDescriptionImpl_00536f40;
  if (this->fNamespace != (XMLCh *)0x0) {
    pMVar1 = XMLGrammarDescription::getMemoryManager((XMLGrammarDescription *)this);
    (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fNamespace);
  }
  if ((this->fLocationHints != (RefArrayVectorOf<char16_t> *)0x0) &&
     (this->fLocationHints != (RefArrayVectorOf<char16_t> *)0x0)) {
    (*(this->fLocationHints->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])();
  }
  if ((this->fTriggeringComponent != (QName *)0x0) && (this->fTriggeringComponent != (QName *)0x0))
  {
    (*(this->fTriggeringComponent->super_XSerializable)._vptr_XSerializable[1])();
  }
  if ((this->fEnclosingElementName != (QName *)0x0) && (this->fEnclosingElementName != (QName *)0x0)
     ) {
    (*(this->fEnclosingElementName->super_XSerializable)._vptr_XSerializable[1])();
  }
  XMLSchemaDescription::~XMLSchemaDescription(&this->super_XMLSchemaDescription);
  return;
}

Assistant:

XMLSchemaDescriptionImpl::~XMLSchemaDescriptionImpl()
{
    if (fNamespace)
        XMLGrammarDescription::getMemoryManager()->deallocate((void*)fNamespace);

    if (fLocationHints)
        delete fLocationHints;

    if (fTriggeringComponent)
        delete fTriggeringComponent;

    if (fEnclosingElementName)
        delete fEnclosingElementName;

}